

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O2

bool shm::key_copy(shm_key_t *dst_key,char *src_key)

{
  *(char *)((long)dst_key + 0) = '\0';
  *(char *)((long)dst_key + 1) = '\0';
  *(char *)((long)dst_key + 2) = '\0';
  *(char *)((long)dst_key + 3) = '\0';
  *(char *)((long)dst_key + 4) = '\0';
  *(char *)((long)dst_key + 5) = '\0';
  *(char *)((long)dst_key + 6) = '\0';
  *(char *)((long)dst_key + 7) = '\0';
  *(char *)((long)dst_key + 8) = '\0';
  *(char *)((long)dst_key + 9) = '\0';
  *(char *)((long)dst_key + 10) = '\0';
  *(char *)((long)dst_key + 0xb) = '\0';
  *(char *)((long)dst_key + 0xc) = '\0';
  *(char *)((long)dst_key + 0xd) = '\0';
  *(char *)((long)dst_key + 0xe) = '\0';
  *(char *)((long)dst_key + 0xf) = '\0';
  *(char *)((long)dst_key + 0x10) = '\0';
  *(char *)((long)dst_key + 0x11) = '\0';
  *(char *)((long)dst_key + 0x12) = '\0';
  *(char *)((long)dst_key + 0x13) = '\0';
  *(char *)((long)dst_key + 0x14) = '\0';
  *(char *)((long)dst_key + 0x15) = '\0';
  *(char *)((long)dst_key + 0x16) = '\0';
  *(char *)((long)dst_key + 0x17) = '\0';
  strncpy(*dst_key,src_key,0x18);
  return true;
}

Assistant:

bool      
shm::key_copy( shm_key_t               &dst_key,
               const   shm_key_t        src_key )
{
#if _USE_POSIX_SHM_ == 1
    //string key
    std::memset( dst_key, '\0', shm_key_length );
    std::strncpy(   (char*) dst_key,
                    src_key,
                    shm_key_length );
    return( true );                    
#elif _USE_SYSTEMV_SHM_ == 1
    dst_key = src_key;
    return( true );
#else
    //not implemented
    return( false );
#endif
}